

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

bool duckdb::ParquetWriter::TryGetParquetType
               (LogicalType *duckdb_type,
               optional_ptr<duckdb_parquet::Type::type,_true> parquet_type_ptr)

{
  PhysicalType PVar1;
  InternalException *this;
  bool bVar2;
  optional_ptr<duckdb_parquet::Type::type,_true> local_48;
  string local_40;
  type tVar3;
  
  bVar2 = false;
  tVar3 = BOOLEAN;
  local_48.ptr = parquet_type_ptr.ptr;
  switch(duckdb_type->id_) {
  case BOOLEAN:
    break;
  case TINYINT:
  case SMALLINT:
  case INTEGER:
  case DATE:
  case UTINYINT:
  case USMALLINT:
  case UINTEGER:
    tVar3 = INT32;
    break;
  case BIGINT:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case UBIGINT:
  case TIMESTAMP_TZ:
  case TIME_TZ:
switchD_01b60fb1_caseD_e:
    tVar3 = INT64;
    break;
  case DECIMAL:
    PVar1 = duckdb_type->physical_type_;
    if (UINT64 < PVar1) {
      if (PVar1 == INT128) goto switchD_01b60fb1_caseD_1b;
      if (PVar1 != INT64) goto LAB_01b61011;
      goto switchD_01b60fb1_caseD_e;
    }
    tVar3 = INT32;
    if ((PVar1 != INT16) && (PVar1 != INT32)) {
LAB_01b61011:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unsupported internal decimal type","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case FLOAT:
    tVar3 = FLOAT;
    break;
  case DOUBLE:
  case UHUGEINT:
  case HUGEINT:
    tVar3 = DOUBLE;
    break;
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    goto switchD_01b60fb1_caseD_18;
  case INTERVAL:
  case UUID:
switchD_01b60fb1_caseD_1b:
    tVar3 = FIXED_LEN_BYTE_ARRAY;
    break;
  default:
    if (duckdb_type->id_ != ENUM) {
      return false;
    }
  case VARCHAR:
  case BLOB:
    tVar3 = BYTE_ARRAY;
  }
  if (parquet_type_ptr.ptr != (type *)0x0) {
    optional_ptr<duckdb_parquet::Type::type,_true>::CheckValid(&local_48);
    *local_48.ptr = tVar3;
  }
  bVar2 = true;
switchD_01b60fb1_caseD_18:
  return bVar2;
}

Assistant:

bool ParquetWriter::TryGetParquetType(const LogicalType &duckdb_type, optional_ptr<Type::type> parquet_type_ptr) {
	Type::type parquet_type;
	switch (duckdb_type.id()) {
	case LogicalTypeId::BOOLEAN:
		parquet_type = Type::BOOLEAN;
		break;
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::DATE:
		parquet_type = Type::INT32;
		break;
	case LogicalTypeId::BIGINT:
		parquet_type = Type::INT64;
		break;
	case LogicalTypeId::FLOAT:
		parquet_type = Type::FLOAT;
		break;
	case LogicalTypeId::DOUBLE:
		parquet_type = Type::DOUBLE;
		break;
	case LogicalTypeId::UHUGEINT:
	case LogicalTypeId::HUGEINT:
		parquet_type = Type::DOUBLE;
		break;
	case LogicalTypeId::ENUM:
	case LogicalTypeId::BLOB:
	case LogicalTypeId::VARCHAR:
		parquet_type = Type::BYTE_ARRAY;
		break;
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIME_TZ:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::TIMESTAMP_SEC:
		parquet_type = Type::INT64;
		break;
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
	case LogicalTypeId::UINTEGER:
		parquet_type = Type::INT32;
		break;
	case LogicalTypeId::UBIGINT:
		parquet_type = Type::INT64;
		break;
	case LogicalTypeId::INTERVAL:
	case LogicalTypeId::UUID:
		parquet_type = Type::FIXED_LEN_BYTE_ARRAY;
		break;
	case LogicalTypeId::DECIMAL:
		switch (duckdb_type.InternalType()) {
		case PhysicalType::INT16:
		case PhysicalType::INT32:
			parquet_type = Type::INT32;
			break;
		case PhysicalType::INT64:
			parquet_type = Type::INT64;
			break;
		case PhysicalType::INT128:
			parquet_type = Type::FIXED_LEN_BYTE_ARRAY;
			break;
		default:
			throw InternalException("Unsupported internal decimal type");
		}
		break;
	default:
		// Anything that is not supported
		return false;
	}
	if (parquet_type_ptr) {
		*parquet_type_ptr = parquet_type;
	}
	return true;
}